

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O1

void MULTILABEL::output_example(vw *all,example *ec)

{
  int iVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  float *pfVar4;
  float *pfVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  stringstream ss;
  undefined7 in_stack_fffffffffffffe08;
  char cVar16;
  vw *all_00;
  string *psVar17;
  int *piVar18;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar2 = (ec->l).cs.costs._begin;
  pwVar3 = (ec->l).cs.costs._end;
  lVar10 = (long)pwVar3 - (long)pwVar2;
  if (lVar10 == 0) {
    fVar15 = 0.0;
  }
  else {
    pfVar4 = (ec->pred).scalars._begin;
    pfVar5 = (ec->pred).scalars._end;
    uVar8 = (long)pfVar5 - (long)pfVar4 >> 2;
    uVar12 = 0;
    uVar11 = lVar10 >> 2;
    if (pfVar5 == pfVar4) {
      fVar15 = 0.0;
      uVar13 = 0;
    }
    else {
      fVar15 = 0.0;
      uVar13 = 0;
      uVar14 = 0;
      do {
        if (uVar11 <= uVar14) break;
        if ((uint)pfVar4[uVar13] < (uint)(&pwVar2->x)[uVar14]) {
          uVar13 = (ulong)((int)uVar13 + 1);
LAB_0024090a:
          fVar15 = fVar15 + 1.0;
        }
        else {
          if ((uint)(&pwVar2->x)[uVar14] < (uint)pfVar4[uVar13]) {
            uVar14 = uVar14 + 1;
            goto LAB_0024090a;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          uVar14 = uVar14 + 1;
        }
      } while (uVar13 < uVar8);
      uVar12 = (ulong)uVar14;
    }
    fVar15 = fVar15 + (float)(uVar11 - uVar12) + (float)(uVar8 - uVar13);
  }
  all_00 = all;
  shared_data::update(all->sd,ec->test_only,pwVar3 != pwVar2,fVar15,1.0,ec->num_features);
  piVar9 = (all->final_prediction_sink)._begin;
  piVar18 = (all->final_prediction_sink)._end;
  if (piVar9 != piVar18) {
    psVar17 = (string *)&ec->tag;
    do {
      iVar1 = *piVar9;
      if (-1 < iVar1) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        if ((ec->pred).scalars._end != (ec->pred).scalars._begin) {
          uVar8 = 0;
          do {
            if (uVar8 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,&stack0xfffffffffffffe0f,1);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            uVar8 = uVar8 + 1;
          } while (uVar8 < (ulong)((long)(ec->pred).scalars._end - (long)(ec->pred).scalars._begin
                                  >> 2));
        }
        cVar16 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,&stack0xfffffffffffffe0f,1);
        p_Var6 = all_00->print_text;
        std::__cxx11::stringbuf::str();
        vVar7._begin._7_1_ = cVar16;
        vVar7._begin._0_7_ = in_stack_fffffffffffffe08;
        vVar7._end = (char *)all_00;
        vVar7.end_array = (char *)psVar17;
        vVar7.erase_count = (size_t)piVar18;
        (*p_Var6)(iVar1,*psVar17,vVar7);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      piVar9 = piVar9 + 1;
    } while (piVar9 != piVar18);
  }
  print_update(all_00,(ec->l).cs.costs._end == (ec->l).cs.costs._begin,ec);
  return;
}

Assistant:

void output_example(vw& all, example& ec)
{
  labels& ld = ec.l.multilabels;

  float loss = 0.;
  if (!test_label(&ld))
  {
    // need to compute exact loss
    labels preds = ec.pred.multilabels;
    labels given = ec.l.multilabels;

    uint32_t preds_index = 0;
    uint32_t given_index = 0;

    while (preds_index < preds.label_v.size() && given_index < given.label_v.size())
    {
      if (preds.label_v[preds_index] < given.label_v[given_index])
      {
        preds_index++;
        loss++;
      }
      else if (preds.label_v[preds_index] > given.label_v[given_index])
      {
        given_index++;
        loss++;
      }
      else
      {
        preds_index++;
        given_index++;
      }
    }
    loss += given.label_v.size() - given_index;
    loss += preds.label_v.size() - preds_index;
  }

  all.sd->update(ec.test_only, !test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (sink >= 0)
    {
      std::stringstream ss;

      for (size_t i = 0; i < ec.pred.multilabels.label_v.size(); i++)
      {
        if (i > 0)
          ss << ',';
        ss << ec.pred.multilabels.label_v[i];
      }
      ss << ' ';
      all.print_text(sink, ss.str(), ec.tag);
    }

  print_update(all, test_label(&ec.l.multilabels), ec);
}